

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_grzip.c
# Opt level: O3

int grzip_bidder_init(archive_read_filter *self)

{
  int iVar1;
  
  iVar1 = __archive_read_program(self,"grzip -d");
  self->code = 0xc;
  self->name = "grzip";
  return iVar1;
}

Assistant:

static int
grzip_bidder_init(struct archive_read_filter *self)
{
	int r;

	r = __archive_read_program(self, "grzip -d");
	/* Note: We set the format here even if __archive_read_program()
	 * above fails.  We do, after all, know what the format is
	 * even if we weren't able to read it. */
	self->code = ARCHIVE_FILTER_GRZIP;
	self->name = "grzip";
	return (r);
}